

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdmanager.cc
# Opt level: O3

int __thiscall bdNodeManager::SearchOutOfDate(bdNodeManager *this)

{
  return 1;
}

Assistant:

int bdNodeManager::SearchOutOfDate() {
#ifdef DEBUG_MGR
	std::cerr << "bdNodeManager::SearchOutOfDate()";
	std::cerr << std::endl;
#endif

	std::map<bdNodeId, bdQueryPeer>::iterator it;

	/* search for out-of-date peers */
	for (it = mActivePeers.begin(); it != mActivePeers.end(); it++) {
#if 0
		if (old) {
			addQuery(it->first);
		}
#endif
	}

	return 1;
}